

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void crunch_backwards(membuf *inbuf,membuf *outbuf,crunch_options *options,crunch_info *info)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  search_nodep snp;
  crunch_options *pcVar4;
  int copy_used;
  encode_match_data emd;
  int local_5c;
  membuf *local_58;
  crunch_info *local_50;
  _encode_match_data local_48;
  
  pcVar4 = default_options;
  if (options != (crunch_options *)0x0) {
    pcVar4 = options;
  }
  local_48.out = (output_ctxp)0x0;
  local_58 = outbuf;
  local_50 = info;
  puVar2 = (undefined8 *)malloc(0x40);
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[3] = optimal_encode_int;
  puVar2[4] = optimal_encode_int;
  local_48.priv = puVar2;
  puVar3 = (undefined8 *)malloc(0x40);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar2[5] = puVar3;
  puVar2[6] = 0;
  match_ctx_init(crunch_backwards::ctx,inbuf,pcVar4->max_len,pcVar4->max_offset,
                 pcVar4->use_imprecise_rle);
  local_48.out = (output_ctxp)0x0;
  puVar2 = (undefined8 *)malloc(0x40);
  puVar2[2] = 0;
  puVar2[3] = 0;
  puVar2[4] = 0;
  puVar2[5] = 0;
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[6] = 0;
  puVar2[7] = 0;
  puVar2[3] = optimal_encode_int;
  puVar2[4] = optimal_encode_int;
  local_48.priv = puVar2;
  puVar3 = (undefined8 *)malloc(0x40);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar2[5] = puVar3;
  puVar2[6] = 0;
  snp = do_compress(crunch_backwards::ctx,&local_48,pcVar4->exported_encoding,pcVar4->max_passes,
                    pcVar4->use_literal_sequences);
  iVar1 = do_output(crunch_backwards::ctx,snp,&local_48,optimal_encode,local_58,&local_5c);
  optimal_free(&local_48);
  match_ctx_free(crunch_backwards::ctx);
  if (local_50 != (crunch_info *)0x0) {
    local_50->literal_sequences_used = local_5c;
    local_50->needed_safety_offset = iVar1;
  }
  return;
}

Assistant:

void crunch_backwards(struct membuf *inbuf,
                      struct membuf *outbuf,
                      struct crunch_options *options, /* IN */
                      struct crunch_info *info) /* OUT */
{
    static match_ctx ctx;
    encode_match_data emd;
    search_nodep snp;
    int outlen;
    int safety;
    int copy_used;

    if(options == NULL)
    {
        options = default_options;
    }

    outlen = membuf_memlen(outbuf);
    emd->out = NULL;
    optimal_init(emd);

    //LOG(LOG_NORMAL, (" Length of indata: %d bytes.\n", membuf_memlen(inbuf)));

    match_ctx_init(ctx, inbuf, options->max_len, options->max_offset,
                   options->use_imprecise_rle);


    emd->out = NULL;
    optimal_init(emd);

    snp = do_compress(ctx, emd, options->exported_encoding,
                      options->max_passes, options->use_literal_sequences);

    safety = do_output(ctx, snp, emd, optimal_encode, outbuf, &copy_used);
    //LOG(LOG_NORMAL, (" Length of crunched data: %d bytes.\n",membuf_memlen(outbuf) - outlen));

    optimal_free(emd);
    search_node_free(snp);
    match_ctx_free(ctx);

    if(info != NULL)
    {
        info->literal_sequences_used = copy_used;
        info->needed_safety_offset = safety;
    }
}